

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryArticulatedSystemsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryArticulatedSystemsLoader::begin__kinematics
          (LibraryArticulatedSystemsLoader *this)

{
  void *pvVar1;
  URI *in_RDI;
  URI uri;
  String *in_stack_fffffffffffffee8;
  String *in_stack_ffffffffffffff00;
  URI *in_stack_ffffffffffffff08;
  KinematicsController *in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff77;
  URI *in_stack_ffffffffffffff78;
  URI *in_stack_ffffffffffffff80;
  
  (**(code **)(*(long *)&in_RDI->mUriString + 0x58))();
  COLLADABU::URI::URI(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                      (bool)in_stack_ffffffffffffff77);
  COLLADABU::URI::setFragment(in_RDI,in_stack_fffffffffffffee8);
  pvVar1 = operator_new(0x140);
  KinematicsController::KinematicsController
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  *(void **)&in_RDI->mAuthority = pvVar1;
  COLLADABU::URI::~URI(in_RDI);
  return true;
}

Assistant:

bool LibraryArticulatedSystemsLoader::begin__kinematics()
	{
		COLLADABU::URI uri(getFileUri());
		uri.setFragment( mCurrentArticulatedId );
		mCurrentKinematicsController = new KinematicsController( uri, mCurrentArticulatedName );
		return true;
	}